

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O2

void __thiscall DataSet::save(DataSet *this,string *filepath,WriteInfo *info)

{
  ostream *poVar1;
  pointer pbVar2;
  undefined8 uVar3;
  Matrix<double> *this_00;
  uint i;
  pointer pbVar4;
  uint j;
  uint col;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  Shape local_238;
  ofstream file;
  byte abStack_208 [480];
  
  std::ofstream::ofstream(&file,(string *)filepath,_S_out);
  if ((abStack_208[*(long *)(_file + -0x18)] & 5) == 0) {
    if (info->shape_skip == false) {
      local_238.n_row = (this->m_matrix).m_shape.n_row;
      local_238.n_col = (this->m_matrix).m_shape.n_col;
      local_238.is_diogonal = (this->m_matrix).m_shape.is_diogonal;
      poVar1 = operator<<((ostream *)&file,&local_238);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if (info->header_skip == false) {
      pbVar4 = (this->m_labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->m_labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar4 != pbVar2) {
        for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < (ulong)((long)pbVar2 - (long)pbVar4 >> 5);
            uVar5 = uVar5 + 1) {
          std::operator<<((ostream *)&file,(string *)(pbVar4 + uVar6));
          pbVar4 = (this->m_labels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (this->m_labels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (uVar6 < ((long)pbVar2 - (long)pbVar4 >> 5) - 1U) {
            std::operator<<((ostream *)&file,',');
            pbVar4 = (this->m_labels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pbVar2 = (this->m_labels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        std::endl<char,std::char_traits<char>>((ostream *)&file);
      }
    }
    this_00 = &this->m_matrix;
    for (uVar5 = 0; uVar3._0_4_ = (this_00->m_shape).n_row, uVar3._4_4_ = (this_00->m_shape).n_col,
        uVar5 < (uint)(undefined4)uVar3; uVar5 = uVar5 + 1) {
      for (col = 0; col < (uint)((ulong)uVar3 >> 0x20); col = col + 1) {
        dVar7 = Matrix<double>::get(this_00,uVar5,col);
        std::ostream::_M_insert<double>(dVar7);
        uVar3._0_4_ = (this_00->m_shape).n_row;
        uVar3._4_4_ = (this_00->m_shape).n_col;
        if (col < uVar3._4_4_ - 1) {
          std::operator<<((ostream *)&file,", ");
          uVar3._0_4_ = (this_00->m_shape).n_row;
          uVar3._4_4_ = (this_00->m_shape).n_col;
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&file);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&file);
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [saving dataset]: Couldn\'t open up the file!\n");
  exit(1);
}

Assistant:

void DataSet::save(const std::string& filepath, const WriteInfo& info) const{
    std::ofstream file(filepath);
    
    if(!file){
        std::cout<<"ERROR [saving dataset]: Couldn't open up the file!\n";
        exit(1);
    }

    if(!info.shape_skip){
        file<<m_matrix.shape()<<std::endl;
    }
    if(!info.header_skip && !m_labels.empty()){
        for(unsigned i=0;i<m_labels.size();++i){
            file<<m_labels[i];
            if(i<m_labels.size()-1) file<<',';
        }   file<<std::endl;
    }

    for(unsigned i=0;i<m_matrix.shape().n_row;++i){
        for(unsigned j=0;j<m_matrix.shape().n_col;++j){
            file<<m_matrix.get(i,j);
            if(j<m_matrix.shape().n_col-1) file<<", ";
        }   file<<std::endl;
    }

    file.close();
}